

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.h
# Opt level: O2

HRESULT __thiscall
CustomMessage<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/WScriptJsrt.cpp:987:39),_WScriptJsrt::CallbackMessage>
::Call(CustomMessage<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chakra_core[P]ChakraCore_bin_ch_WScriptJsrt_cpp:987:39),_WScriptJsrt::CallbackMessage>
       *this,LPCSTR fileName)

{
  HRESULT HVar1;
  Debugger *this_00;
  JsContextRef local_30;
  JsContextRef currentContext;
  JsRuntimeHandle currentRuntime;
  
  local_30 = (JsContextRef)0x0;
  (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetCurrentContext)(&local_30);
  currentContext = (JsContextRef)0x0;
  (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetRuntime)(local_30,&currentContext);
  if (Debugger::debugger != (Debugger *)0x0) {
    this_00 = Debugger::GetDebugger(currentContext);
    Debugger::StopDebugging(this_00,currentContext);
  }
  HVar1 = WScriptJsrt::CallbackMessage::CallFunction(&this->super_CallbackMessage,"");
  return HVar1;
}

Assistant:

virtual HRESULT Call(LPCSTR fileName) override
    {
        return m_func(*this);
    }